

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

TArray<SBarInfoCommand_*,_SBarInfoCommand_*> * __thiscall
TArray<SBarInfoCommand_*,_SBarInfoCommand_*>::operator=
          (TArray<SBarInfoCommand_*,_SBarInfoCommand_*> *this,
          TArray<SBarInfoCommand_*,_SBarInfoCommand_*> *other)

{
  TArray<SBarInfoCommand_*,_SBarInfoCommand_*> *other_local;
  TArray<SBarInfoCommand_*,_SBarInfoCommand_*> *this_local;
  
  if (this->Array != (SBarInfoCommand **)0x0) {
    if (this->Count != 0) {
      DoDelete(this,0,this->Count - 1);
    }
    M_Free(this->Array);
  }
  this->Array = other->Array;
  other->Array = (SBarInfoCommand **)0x0;
  this->Most = other->Most;
  other->Most = 0;
  this->Count = other->Count;
  other->Count = 0;
  return this;
}

Assistant:

TArray<T,TT> &operator= (TArray<T,TT> &&other)
	{
		if (Array)
		{
			if (Count > 0)
			{
				DoDelete (0, Count-1);
			}
			M_Free (Array);
		}
		Array = other.Array; other.Array = NULL;
		Most = other.Most; other.Most = 0;
		Count = other.Count; other.Count = 0;
		return *this;
	}